

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::add_sub<false,false,unsigned_short>
               (unsigned_short source,unsigned_short *destination,Status *status)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = *destination;
  uVar2 = uVar1 - source;
  status->carry_flag = (ulong)(uVar1 < source);
  status->extend_flag = (ulong)(uVar1 < source);
  status->zero_result = (ulong)(uint)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x8000);
  status->overflow_flag = (ulong)((uVar1 ^ source) & 0x8000 & (uint)(uVar2 ^ uVar1));
  *destination = uVar2;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}